

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeDelete(BtCursor *pCur,u8 flags)

{
  char cVar1;
  ushort uVar2;
  ushort uVar3;
  Btree *pBtree;
  BtShared *pBt;
  MemPage *pPage;
  MemPage *pPage_00;
  bool bVar4;
  u16 uVar5;
  int iVar6;
  int iVar7;
  char cVar8;
  long lVar9;
  u8 *puVar10;
  long lVar11;
  undefined7 in_register_00000031;
  u8 *puVar12;
  MemPage **ppMVar13;
  uint uVar14;
  CellInfo info;
  int local_60;
  Pgno local_5c;
  ulong local_58;
  long local_50;
  CellInfo local_48;
  
  iVar7 = (int)CONCAT71(in_register_00000031,flags);
  pBtree = pCur->pBtree;
  pBt = pBtree->pBt;
  if ((pCur->eState == '\x03') && (iVar6 = btreeRestoreCursorPosition(pCur), iVar6 != 0)) {
    return iVar6;
  }
  cVar1 = pCur->iPage;
  uVar2 = pCur->ix;
  pPage = pCur->pPage;
  puVar10 = pPage->aData +
            (CONCAT11(pPage->aCellIdx[(ulong)uVar2 * 2],pPage->aCellIdx[(ulong)uVar2 * 2 + 1]) &
            pPage->maskPage);
  if ((pPage->nFree < 0) && (iVar6 = btreeComputeFreeSpace(pPage), iVar6 != 0)) {
    return 0xb;
  }
  bVar4 = true;
  if ((flags & 2) != 0) {
    if (pPage->leaf != '\0') {
      iVar6 = pPage->nFree;
      puVar12 = puVar10;
      uVar5 = cellSizePtr(pPage,puVar10);
      iVar7 = (int)puVar12;
      if (((int)((uint)uVar5 + iVar6 + 2) <= (int)((pBt->usableSize * 2) / 3)) &&
         (pPage->nCell != 1)) {
        bVar4 = false;
        goto LAB_0015ffe7;
      }
    }
    iVar6 = saveCursorKey(pCur);
    if (iVar6 != 0) {
      return iVar6;
    }
  }
LAB_0015ffe7:
  if (((pPage->leaf != '\0') || (iVar7 = sqlite3BtreePrevious(pCur,iVar7), iVar7 == 0)) &&
     (((pCur->curFlags & 0x20) == 0 || (iVar7 = saveAllCursors(pBt,pCur->pgnoRoot,pCur), iVar7 == 0)
      ))) {
    if (pCur->pKeyInfo == (KeyInfo *)0x0) {
      invalidateIncrblobCursors(pBtree,pCur->pgnoRoot,(pCur->info).nKey,0);
    }
    iVar7 = sqlite3PagerWrite(pPage->pDbPage);
    if (iVar7 == 0) {
      local_60 = clearCell(pPage,puVar10,&local_48);
      dropCell(pPage,(uint)uVar2,(uint)local_48.nSize,&local_60);
      iVar7 = local_60;
      if (local_60 == 0) {
        lVar11 = (long)(int)cVar1;
        if (pPage->leaf == '\0') {
          pPage_00 = pCur->pPage;
          local_50 = lVar11;
          if ((pPage_00->nFree < 0) && (iVar7 = btreeComputeFreeSpace(pPage_00), iVar7 != 0)) {
            return iVar7;
          }
          ppMVar13 = &pCur->pPage;
          if ((int)local_50 < pCur->iPage + -1) {
            ppMVar13 = pCur->apPage + local_50 + 1;
          }
          uVar14 = (uint)(CONCAT11(pPage_00->aCellIdx[(ulong)pPage_00->nCell * 2 + -2],
                                   pPage_00->aCellIdx[(ulong)pPage_00->nCell * 2 + -1]) &
                         pPage_00->maskPage);
          if (uVar14 < 4) {
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x119a4,
                        "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
            return 0xb;
          }
          local_5c = (*ppMVar13)->pgno;
          puVar10 = pPage_00->aData;
          uVar5 = (*pPage_00->xCellSize)(pPage_00,puVar10 + uVar14);
          local_58 = (ulong)uVar5;
          puVar12 = pBt->pTmpSpace;
          local_60 = sqlite3PagerWrite(pPage_00->pDbPage);
          if (local_60 == 0) {
            insertCell(pPage,(uint)uVar2,puVar10 + uVar14 + -4,(int)local_58 + 4,puVar12,local_5c,
                       &local_60);
          }
          dropCell(pPage_00,pPage_00->nCell - 1,(int)local_58,&local_60);
          lVar11 = local_50;
          if (local_60 != 0) {
            return local_60;
          }
        }
        iVar7 = balance(pCur);
        if (iVar7 == 0) {
          if ((char)lVar11 < pCur->iPage) {
            sqlite3PagerUnrefNotNull(pCur->pPage->pDbPage);
            cVar8 = pCur->iPage + -1;
            pCur->iPage = cVar8;
            if (cVar1 < cVar8) {
              do {
                pCur->iPage = cVar8 + -1;
                lVar9 = (long)cVar8;
                cVar8 = cVar8 + -1;
                if (pCur->apPage[lVar9] != (MemPage *)0x0) {
                  sqlite3PagerUnrefNotNull(pCur->apPage[lVar9]->pDbPage);
                  cVar8 = pCur->iPage;
                }
              } while ((char)lVar11 < cVar8);
            }
            pCur->pPage = pCur->apPage[cVar8];
            iVar7 = balance(pCur);
            if (iVar7 != 0) {
              return iVar7;
            }
          }
          if (bVar4) {
            iVar6 = moveToRoot(pCur);
            if ((flags & 2) != 0) {
              btreeReleaseAllCursorPages(pCur);
              pCur->eState = '\x03';
            }
            iVar7 = 0;
            if (iVar6 != 0x10) {
              iVar7 = iVar6;
            }
          }
          else {
            pCur->eState = '\x02';
            uVar3 = pPage->nCell;
            if (uVar2 < uVar3) {
              pCur->skipNext = 1;
            }
            else {
              pCur->skipNext = -1;
              pCur->ix = uVar3 - 1;
            }
            iVar7 = 0;
          }
        }
      }
    }
  }
  return iVar7;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeDelete(BtCursor *pCur, u8 flags){
  Btree *p = pCur->pBtree;
  BtShared *pBt = p->pBt;              
  int rc;                              /* Return code */
  MemPage *pPage;                      /* Page to delete cell from */
  unsigned char *pCell;                /* Pointer to cell to delete */
  int iCellIdx;                        /* Index of cell to delete */
  int iCellDepth;                      /* Depth of node containing pCell */ 
  CellInfo info;                       /* Size of the cell being deleted */
  int bSkipnext = 0;                   /* Leaf cursor in SKIPNEXT state */
  u8 bPreserve = flags & BTREE_SAVEPOSITION;  /* Keep cursor valid */

  assert( cursorOwnsBtShared(pCur) );
  assert( pBt->inTransaction==TRANS_WRITE );
  assert( (pBt->btsFlags & BTS_READ_ONLY)==0 );
  assert( pCur->curFlags & BTCF_WriteFlag );
  assert( hasSharedCacheTableLock(p, pCur->pgnoRoot, pCur->pKeyInfo!=0, 2) );
  assert( !hasReadConflicts(p, pCur->pgnoRoot) );
  assert( (flags & ~(BTREE_SAVEPOSITION | BTREE_AUXDELETE))==0 );
  if( pCur->eState==CURSOR_REQUIRESEEK ){
    rc = btreeRestoreCursorPosition(pCur);
    if( rc ) return rc;
  }
  assert( pCur->eState==CURSOR_VALID );

  iCellDepth = pCur->iPage;
  iCellIdx = pCur->ix;
  pPage = pCur->pPage;
  pCell = findCell(pPage, iCellIdx);
  if( pPage->nFree<0 && btreeComputeFreeSpace(pPage) ) return SQLITE_CORRUPT;

  /* If the bPreserve flag is set to true, then the cursor position must
  ** be preserved following this delete operation. If the current delete
  ** will cause a b-tree rebalance, then this is done by saving the cursor
  ** key and leaving the cursor in CURSOR_REQUIRESEEK state before 
  ** returning. 
  **
  ** Or, if the current delete will not cause a rebalance, then the cursor
  ** will be left in CURSOR_SKIPNEXT state pointing to the entry immediately
  ** before or after the deleted entry. In this case set bSkipnext to true.  */
  if( bPreserve ){
    if( !pPage->leaf 
     || (pPage->nFree+cellSizePtr(pPage,pCell)+2)>(int)(pBt->usableSize*2/3)
     || pPage->nCell==1  /* See dbfuzz001.test for a test case */
    ){
      /* A b-tree rebalance will be required after deleting this entry.
      ** Save the cursor key.  */
      rc = saveCursorKey(pCur);
      if( rc ) return rc;
    }else{
      bSkipnext = 1;
    }
  }

  /* If the page containing the entry to delete is not a leaf page, move
  ** the cursor to the largest entry in the tree that is smaller than
  ** the entry being deleted. This cell will replace the cell being deleted
  ** from the internal node. The 'previous' entry is used for this instead
  ** of the 'next' entry, as the previous entry is always a part of the
  ** sub-tree headed by the child page of the cell being deleted. This makes
  ** balancing the tree following the delete operation easier.  */
  if( !pPage->leaf ){
    rc = sqlite3BtreePrevious(pCur, 0);
    assert( rc!=SQLITE_DONE );
    if( rc ) return rc;
  }

  /* Save the positions of any other cursors open on this table before
  ** making any modifications.  */
  if( pCur->curFlags & BTCF_Multiple ){
    rc = saveAllCursors(pBt, pCur->pgnoRoot, pCur);
    if( rc ) return rc;
  }

  /* If this is a delete operation to remove a row from a table b-tree,
  ** invalidate any incrblob cursors open on the row being deleted.  */
  if( pCur->pKeyInfo==0 ){
    invalidateIncrblobCursors(p, pCur->pgnoRoot, pCur->info.nKey, 0);
  }

  /* Make the page containing the entry to be deleted writable. Then free any
  ** overflow pages associated with the entry and finally remove the cell
  ** itself from within the page.  */
  rc = sqlite3PagerWrite(pPage->pDbPage);
  if( rc ) return rc;
  rc = clearCell(pPage, pCell, &info);
  dropCell(pPage, iCellIdx, info.nSize, &rc);
  if( rc ) return rc;

  /* If the cell deleted was not located on a leaf page, then the cursor
  ** is currently pointing to the largest entry in the sub-tree headed
  ** by the child-page of the cell that was just deleted from an internal
  ** node. The cell from the leaf node needs to be moved to the internal
  ** node to replace the deleted cell.  */
  if( !pPage->leaf ){
    MemPage *pLeaf = pCur->pPage;
    int nCell;
    Pgno n;
    unsigned char *pTmp;

    if( pLeaf->nFree<0 ){
      rc = btreeComputeFreeSpace(pLeaf);
      if( rc ) return rc;
    }
    if( iCellDepth<pCur->iPage-1 ){
      n = pCur->apPage[iCellDepth+1]->pgno;
    }else{
      n = pCur->pPage->pgno;
    }
    pCell = findCell(pLeaf, pLeaf->nCell-1);
    if( pCell<&pLeaf->aData[4] ) return SQLITE_CORRUPT_BKPT;
    nCell = pLeaf->xCellSize(pLeaf, pCell);
    assert( MX_CELL_SIZE(pBt) >= nCell );
    pTmp = pBt->pTmpSpace;
    assert( pTmp!=0 );
    rc = sqlite3PagerWrite(pLeaf->pDbPage);
    if( rc==SQLITE_OK ){
      insertCell(pPage, iCellIdx, pCell-4, nCell+4, pTmp, n, &rc);
    }
    dropCell(pLeaf, pLeaf->nCell-1, nCell, &rc);
    if( rc ) return rc;
  }

  /* Balance the tree. If the entry deleted was located on a leaf page,
  ** then the cursor still points to that page. In this case the first
  ** call to balance() repairs the tree, and the if(...) condition is
  ** never true.
  **
  ** Otherwise, if the entry deleted was on an internal node page, then
  ** pCur is pointing to the leaf page from which a cell was removed to
  ** replace the cell deleted from the internal node. This is slightly
  ** tricky as the leaf node may be underfull, and the internal node may
  ** be either under or overfull. In this case run the balancing algorithm
  ** on the leaf node first. If the balance proceeds far enough up the
  ** tree that we can be sure that any problem in the internal node has
  ** been corrected, so be it. Otherwise, after balancing the leaf node,
  ** walk the cursor up the tree to the internal node and balance it as 
  ** well.  */
  rc = balance(pCur);
  if( rc==SQLITE_OK && pCur->iPage>iCellDepth ){
    releasePageNotNull(pCur->pPage);
    pCur->iPage--;
    while( pCur->iPage>iCellDepth ){
      releasePage(pCur->apPage[pCur->iPage--]);
    }
    pCur->pPage = pCur->apPage[pCur->iPage];
    rc = balance(pCur);
  }

  if( rc==SQLITE_OK ){
    if( bSkipnext ){
      assert( bPreserve && (pCur->iPage==iCellDepth || CORRUPT_DB) );
      assert( pPage==pCur->pPage || CORRUPT_DB );
      assert( (pPage->nCell>0 || CORRUPT_DB) && iCellIdx<=pPage->nCell );
      pCur->eState = CURSOR_SKIPNEXT;
      if( iCellIdx>=pPage->nCell ){
        pCur->skipNext = -1;
        pCur->ix = pPage->nCell-1;
      }else{
        pCur->skipNext = 1;
      }
    }else{
      rc = moveToRoot(pCur);
      if( bPreserve ){
        btreeReleaseAllCursorPages(pCur);
        pCur->eState = CURSOR_REQUIRESEEK;
      }
      if( rc==SQLITE_EMPTY ) rc = SQLITE_OK;
    }
  }
  return rc;
}